

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_utils.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::DecNum::setTo
          (DecNum *this,uint8_t *bcd,int32_t length,int32_t scale,bool isNegative,UErrorCode *status
          )

{
  decNumber *buffer;
  uint8_t uVar1;
  undefined2 uVar2;
  int32_t iVar3;
  int32_t iVar4;
  UErrorCode UVar5;
  decNumber *pdVar6;
  
  iVar4 = 0x22;
  if ((0x22 < length) &&
     (pdVar6 = (decNumber *)uprv_malloc_63((ulong)(length + 0xc)), iVar4 = length,
     pdVar6 != (decNumber *)0x0)) {
    buffer = (this->fData).ptr;
    uVar1 = buffer->lsu[0];
    uVar2 = *(undefined2 *)&buffer->field_0xa;
    pdVar6->bits = buffer->bits;
    pdVar6->lsu[0] = uVar1;
    *(undefined2 *)&pdVar6->field_0xa = uVar2;
    iVar3 = buffer->exponent;
    pdVar6->digits = buffer->digits;
    pdVar6->exponent = iVar3;
    if ((this->fData).needToRelease != '\0') {
      uprv_free_63(buffer);
    }
    (this->fData).ptr = pdVar6;
    (this->fData).capacity = length;
    (this->fData).needToRelease = '\x01';
  }
  (this->fContext).digits = iVar4;
  UVar5 = U_UNSUPPORTED_ERROR;
  if ((0xc4653600 < length + 0xc4653600U) &&
     (-0x3b9ac9fe - length <= scale && scale <= 1000000000 - length)) {
    pdVar6 = (this->fData).ptr;
    pdVar6->digits = length;
    pdVar6->exponent = scale;
    pdVar6->bits = isNegative << 7;
    uprv_decNumberSetBCD_63(pdVar6,bcd,length);
    UVar5 = U_INTERNAL_PROGRAM_ERROR;
    if ((this->fContext).status == 0) {
      return;
    }
  }
  *status = UVar5;
  return;
}

Assistant:

void
DecNum::setTo(const uint8_t* bcd, int32_t length, int32_t scale, bool isNegative, UErrorCode& status) {
    if (length > kDefaultDigits) {
        fData.resize(length, 0);
        fContext.digits = length;
    } else {
        fContext.digits = kDefaultDigits;
    }

    // "digits is of type int32_t, and must have a value in the range 1 through 999,999,999."
    if (length < 1 || length > 999999999) {
        // Too large for decNumber
        status = U_UNSUPPORTED_ERROR;
        return;
    }
    // "The exponent field holds the exponent of the number. Its range is limited by the requirement that
    // "the range of the adjusted exponent of the number be balanced and fit within a whole number of
    // "decimal digits (in this implementation, be –999,999,999 through +999,999,999). The adjusted
    // "exponent is the exponent that would result if the number were expressed with a single digit before
    // "the decimal point, and is therefore given by exponent+digits-1."
    if (scale > 999999999 - length + 1 || scale < -999999999 - length + 1) {
        // Too large for decNumber
        status = U_UNSUPPORTED_ERROR;
        return;
    }

    fData.getAlias()->digits = length;
    fData.getAlias()->exponent = scale;
    fData.getAlias()->bits = static_cast<uint8_t>(isNegative ? DECNEG : 0);
    uprv_decNumberSetBCD(fData, bcd, static_cast<uint32_t>(length));
    if (fContext.status != 0) {
        // Some error occurred while constructing the decNumber.
        status = U_INTERNAL_PROGRAM_ERROR;
    }
}